

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

char * ini_property_name(ini_t *ini,int section,int property)

{
  int iVar1;
  char *pcVar2;
  
  if (-1 < section && ini != (ini_t *)0x0) {
    if ((section < ini->section_count) &&
       (iVar1 = ini_internal_property_index(ini,section,property), iVar1 != -1)) {
      pcVar2 = ini->properties[iVar1].name_large;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = ini->properties[iVar1].name;
      }
    }
    else {
      pcVar2 = (char *)0x0;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char const* ini_property_name( ini_t const* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            return ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
        }

    return NULL;
    }